

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::NegativeGLSLLinkTimeErrors::Run(NegativeGLSLLinkTimeErrors *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  bool bVar2;
  GLuint program;
  GLuint GVar3;
  bool *compile_error;
  bool *compile_error_00;
  allocator<char> local_59;
  char *src [2];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)src,
             "\nlayout(local_size_x = 1, local_size_y = 1) in;\nlayout(std430) buffer Output {\n  vec4 data;\n} g_out;\nvoid main() {\n  g_out.data = vec4(1.0, 2.0, 3.0, 4.0);\n}"
             ,&local_59);
  program = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,(string *)src);
  std::__cxx11::string::~string((string *)src);
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  GVar3 = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  glu::CallLogWrapper::glAttachShader(this_00,program,GVar3);
  glu::CallLogWrapper::glDeleteShader(this_00,GVar3);
  src[0] = "#version 310 es\n";
  src[1] = 
  "\nlayout(location = 0) in mediump vec4 g_position;\nvoid main() {\n  gl_Position = g_position;\n}"
  ;
  glu::CallLogWrapper::glShaderSource(this_00,GVar3,2,src,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,GVar3);
  GVar3 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
  glu::CallLogWrapper::glAttachShader(this_00,program,GVar3);
  glu::CallLogWrapper::glDeleteShader(this_00,GVar3);
  src[0] = "#version 310 es\n";
  src[1] = 
  "\nlayout(location = 0) out mediump vec4 g_color;\nvoid main() {\n  g_color = vec4(1);\n}";
  glu::CallLogWrapper::glShaderSource(this_00,GVar3,2,src,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,GVar3);
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  bVar1 = ComputeShaderBase::CheckProgram(&this->super_ComputeShaderBase,program,compile_error);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)src,
             "\nlayout(std430) buffer Output {\n  vec4 data;\n} g_out;\nvoid main() {\n  g_out.data = vec4(1.0, 2.0, 3.0, 4.0);\n}"
             ,&local_59);
  GVar3 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,(string *)src);
  std::__cxx11::string::~string((string *)src);
  glu::CallLogWrapper::glLinkProgram(this_00,GVar3);
  bVar2 = ComputeShaderBase::CheckProgram(&this->super_ComputeShaderBase,GVar3,compile_error_00);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  glu::CallLogWrapper::glDeleteProgram(this_00,GVar3);
  return -(ulong)(bVar1 || bVar2);
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 1, local_size_y = 1) in;" NL "layout(std430) buffer Output {" NL "  vec4 data;" NL
			   "} g_out;" NL "void main() {" NL "  g_out.data = vec4(1.0, 2.0, 3.0, 4.0);" NL "}";
		const char* const glsl_vs = NL "layout(location = 0) in mediump vec4 g_position;" NL "void main() {" NL
									   "  gl_Position = g_position;" NL "}";
		const char* const glsl_fs =
			NL "layout(location = 0) out mediump vec4 g_color;" NL "void main() {" NL "  g_color = vec4(1);" NL "}";

		GLuint p = CreateComputeProgram(glsl_cs);

		{
			const GLuint sh = glCreateShader(GL_VERTEX_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			const char* const src[2] = { kGLSLVer, glsl_vs };
			glShaderSource(sh, 2, src, NULL);
			glCompileShader(sh);
		}
		{
			const GLuint sh = glCreateShader(GL_FRAGMENT_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			const char* const src[2] = { kGLSLVer, glsl_fs };
			glShaderSource(sh, 2, src, NULL);
			glCompileShader(sh);
		}
		long error = NO_ERROR;
		glLinkProgram(p);
		if (CheckProgram(p))
			error = ERROR;

		/* no layout */
		const char* const glsl_cs2 = NL "layout(std430) buffer Output {" NL "  vec4 data;" NL "} g_out;" NL
										"void main() {" NL "  g_out.data = vec4(1.0, 2.0, 3.0, 4.0);" NL "}";

		GLuint p2 = CreateComputeProgram(glsl_cs2);
		glLinkProgram(p2);
		if (CheckProgram(p2))
			error = ERROR;

		glDeleteProgram(p);
		glDeleteProgram(p2);
		return error;
	}